

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86_fma::destroy_pipeline(Convolution_x86_fma *this,Option *opt)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x2c8) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x2c8) + 0x28))(*(long **)(in_RDI + 0x2c8),in_RSI);
    if (*(long **)(in_RDI + 0x2c8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x2c8) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x2c8) = 0;
  }
  if (*(long *)(in_RDI + 0x440) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x440) + 0x28))(*(long **)(in_RDI + 0x440),in_RSI);
    if (*(long **)(in_RDI + 0x440) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x440) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x440) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_fma::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (convolution_dilation1)
    {
        convolution_dilation1->destroy_pipeline(opt);
        delete convolution_dilation1;
        convolution_dilation1 = 0;
    }

    return 0;
}